

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  JDIMENSION JVar2;
  FILE *__stream;
  size_t sVar3;
  cjpeg_source_ptr pcVar4;
  undefined8 *in_RSI;
  int in_EDI;
  JDIMENSION num_scanlines;
  unsigned_long outsize;
  uchar *outbuffer;
  FILE *output_file;
  long icc_len;
  JOCTET *icc_profile;
  FILE *icc_file;
  FILE *input_file;
  cjpeg_source_ptr src_mgr;
  int file_index;
  cdjpeg_progress_mgr progress;
  jpeg_error_mgr jerr;
  jpeg_compress_struct cinfo;
  FILE *infile;
  j_compress_ptr cinfo_00;
  FILE *local_330;
  ulong local_328;
  void *local_320;
  FILE *local_310;
  boolean in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  char **in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd2c;
  JDIMENSION in_stack_fffffffffffffd30;
  boolean in_stack_fffffffffffffd34;
  undefined1 local_2c0 [128];
  long local_240;
  char **local_228;
  undefined4 local_220;
  undefined4 local_21c;
  jpeg_compress_struct local_218;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_320 = (void *)0x0;
  local_328 = 0;
  local_330 = (FILE *)0x0;
  cinfo_00 = (j_compress_ptr)0x0;
  infile = (FILE *)0x0;
  progname = (char *)*in_RSI;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "cjpeg";
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_218.err = (jpeg_error_mgr *)jpeg_std_error(local_2c0);
  jpeg_CreateCompress(&local_218,0x3e,0x208);
  local_228 = cdjpeg_message_table;
  local_220 = 1000;
  local_21c = 0x417;
  local_218.in_color_space = JCS_RGB;
  jpeg_set_defaults(&local_218);
  iVar1 = parse_switches((j_compress_ptr)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,
                         in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18);
  if (iVar1 < local_8 + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
  }
  if (iVar1 < local_8) {
    local_310 = fopen((char *)local_10[iVar1],"rb");
    if (local_310 == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,local_10[iVar1]);
      exit(1);
    }
  }
  else {
    local_310 = (FILE *)read_stdin();
  }
  if (outfilename == (char *)0x0) {
    if (memdst == 0) {
      local_330 = (FILE *)write_stdout();
    }
  }
  else {
    local_330 = fopen(outfilename,"wb");
    if (local_330 == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,outfilename);
      exit(1);
    }
  }
  if (icc_filename != (char *)0x0) {
    __stream = fopen(icc_filename,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,icc_filename);
      exit(1);
    }
    iVar1 = fseek(__stream,0,2);
    if (((iVar1 < 0) || (local_328 = ftell(__stream), (long)local_328 < 1)) ||
       (iVar1 = fseek(__stream,0,0), iVar1 < 0)) {
      fprintf(_stderr,"%s: can\'t determine size of %s\n",progname,icc_filename);
      exit(1);
    }
    local_320 = malloc(local_328);
    if (local_320 == (void *)0x0) {
      fprintf(_stderr,"%s: can\'t allocate memory for ICC profile\n",progname);
      fclose(__stream);
      exit(1);
    }
    sVar3 = fread(local_320,local_328,1,__stream);
    if (sVar3 == 0) {
      fprintf(_stderr,"%s: can\'t read ICC profile from %s\n",progname,icc_filename);
      free(local_320);
      fclose(__stream);
      exit(1);
    }
    fclose(__stream);
  }
  if (report != 0) {
    start_progress_monitor((j_common_ptr)&local_218,(cd_progress_ptr)&stack0xfffffffffffffd08);
    in_stack_fffffffffffffd34 = report;
  }
  pcVar4 = select_file_type(cinfo_00,infile);
  pcVar4->input_file = (FILE *)local_310;
  (*pcVar4->start_input)(&local_218,pcVar4);
  jpeg_default_colorspace(&local_218);
  parse_switches((j_compress_ptr)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
                 in_stack_fffffffffffffd18);
  if (memdst == 0) {
    jpeg_stdio_dest(&local_218,local_330);
  }
  else {
    jpeg_mem_dest(&local_218,&stack0xfffffffffffffcc8,&stack0xfffffffffffffcc0);
  }
  jpeg_start_compress(&local_218,1);
  if (local_320 != (void *)0x0) {
    jpeg_write_icc_profile(&local_218,local_320,local_328 & 0xffffffff);
  }
  while (local_218.next_scanline < local_218.image_height) {
    JVar2 = (*pcVar4->get_pixel_rows)(&local_218,pcVar4);
    jpeg_write_scanlines(&local_218,pcVar4->buffer,JVar2);
  }
  (*pcVar4->finish_input)(&local_218,pcVar4);
  jpeg_finish_compress(&local_218);
  jpeg_destroy_compress(&local_218);
  if (local_310 != _stdin) {
    fclose(local_310);
  }
  if ((local_330 != _stdout) && (local_330 != (FILE *)0x0)) {
    fclose(local_330);
  }
  if (report != 0) {
    end_progress_monitor((j_common_ptr)0x1028cf);
  }
  if (memdst != 0) {
    fprintf(_stderr,"Compressed size:  %lu bytes\n",infile);
    free(cinfo_00);
  }
  free(local_320);
  iVar1 = 0;
  if (local_240 != 0) {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_compress_struct cinfo;
#ifdef CJPEG_FUZZER
  struct my_error_mgr myerr;
  struct jpeg_error_mgr &jerr = myerr.pub;
#else
  struct jpeg_error_mgr jerr;
#endif
  struct cdjpeg_progress_mgr progress;
  int file_index;
  cjpeg_source_ptr src_mgr;
  FILE *input_file = NULL;
  FILE *icc_file;
  JOCTET *icc_profile = NULL;
  long icc_len = 0;
  FILE *output_file = NULL;
  unsigned char *outbuffer = NULL;
  unsigned long outsize = 0;
  JDIMENSION num_scanlines;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "cjpeg";         /* in case C library doesn't provide it */

  /* Initialize the JPEG compression object with default error handling. */
  cinfo.err = jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  /* Add some application-specific error messages (from cderror.h) */
  jerr.addon_message_table = cdjpeg_message_table;
  jerr.first_addon_message = JMSG_FIRSTADDONCODE;
  jerr.last_addon_message = JMSG_LASTADDONCODE;

  /* Initialize JPEG parameters.
   * Much of this may be overridden later.
   * In particular, we don't yet know the input file's color space,
   * but we need to provide some value for jpeg_set_defaults() to work.
   */

  cinfo.in_color_space = JCS_RGB; /* arbitrary guess */
  jpeg_set_defaults(&cinfo);

  /* Scan command line to find file names.
   * It is convenient to use just one switch-parsing routine, but the switch
   * values read here are ignored; we will rescan the switches after opening
   * the input file.
   */

  file_index = parse_switches(&cinfo, argc, argv, 0, FALSE);

#ifdef TWO_FILE_COMMANDLINE
  if (!memdst) {
    /* Must have either -outfile switch or explicit output file name */
    if (outfilename == NULL) {
      if (file_index != argc - 2) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
      outfilename = argv[file_index + 1];
    } else {
      if (file_index != argc - 1) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((input_file = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    input_file = read_stdin();
  }

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((output_file = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, outfilename);
      exit(EXIT_FAILURE);
    }
  } else if (!memdst) {
    /* default output file is stdout */
    output_file = write_stdout();
  }

  if (icc_filename != NULL) {
    if ((icc_file = fopen(icc_filename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (fseek(icc_file, 0, SEEK_END) < 0 ||
        (icc_len = ftell(icc_file)) < 1 ||
        fseek(icc_file, 0, SEEK_SET) < 0) {
      fprintf(stderr, "%s: can't determine size of %s\n", progname,
              icc_filename);
      exit(EXIT_FAILURE);
    }
    if ((icc_profile = (JOCTET *)malloc(icc_len)) == NULL) {
      fprintf(stderr, "%s: can't allocate memory for ICC profile\n", progname);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    if (fread(icc_profile, icc_len, 1, icc_file) < 1) {
      fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
              icc_filename);
      free(icc_profile);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    fclose(icc_file);
  }

#ifdef CJPEG_FUZZER
  jerr.error_exit = my_error_exit;
  jerr.emit_message = my_emit_message;
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  if (report) {
    start_progress_monitor((j_common_ptr)&cinfo, &progress);
    progress.report = report;
  }

  /* Figure out the input file format, and set up to read it. */
  src_mgr = select_file_type(&cinfo, input_file);
  src_mgr->input_file = input_file;
#ifdef CJPEG_FUZZER
  src_mgr->max_pixels = 1048576;
#endif

  /* Read the input file header to obtain file size & colorspace. */
  (*src_mgr->start_input) (&cinfo, src_mgr);

  /* Now that we know input colorspace, fix colorspace-dependent defaults */
  jpeg_default_colorspace(&cinfo);

  /* Adjust default compression parameters by re-parsing the options */
  file_index = parse_switches(&cinfo, argc, argv, 0, TRUE);

  /* Specify data destination for compression */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  if (memdst)
    jpeg_mem_dest(&cinfo, &outbuffer, &outsize);
  else
#endif
    jpeg_stdio_dest(&cinfo, output_file);

#ifdef CJPEG_FUZZER
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  /* Start compressor */
  jpeg_start_compress(&cinfo, TRUE);

  if (icc_profile != NULL)
    jpeg_write_icc_profile(&cinfo, icc_profile, (unsigned int)icc_len);

  /* Process data */
  while (cinfo.next_scanline < cinfo.image_height) {
    num_scanlines = (*src_mgr->get_pixel_rows) (&cinfo, src_mgr);
    (void)jpeg_write_scanlines(&cinfo, src_mgr->buffer, num_scanlines);
  }

  /* Finish compression and release memory */
  (*src_mgr->finish_input) (&cinfo, src_mgr);
  jpeg_finish_compress(&cinfo);
  jpeg_destroy_compress(&cinfo);

  /* Close files, if we opened them */
  if (input_file != stdin)
    fclose(input_file);
  if (output_file != stdout && output_file != NULL)
    fclose(output_file);

  if (report)
    end_progress_monitor((j_common_ptr)&cinfo);

  if (memdst) {
#ifndef CJPEG_FUZZER
    fprintf(stderr, "Compressed size:  %lu bytes\n", outsize);
#endif
    free(outbuffer);
  }

  free(icc_profile);

  /* All done. */
  return (jerr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
}